

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text_format.cc
# Opt level: O2

bool __thiscall google::protobuf::TextFormat::Parser::ParserImpl::SkipFieldMessage(ParserImpl *this)

{
  string *__lhs;
  bool bVar1;
  __type _Var2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  undefined1 local_58 [8];
  string delimiter;
  
  local_58 = (undefined1  [8])&delimiter._M_string_length;
  delimiter._M_dataplus._M_p = (pointer)0x0;
  delimiter._M_string_length._0_1_ = 0;
  bVar1 = ConsumeMessageDelimiter(this,(string *)local_58);
  if (bVar1) {
    __lhs = &(this->tokenizer_).current_.text;
    do {
      std::__cxx11::string::string
                ((string *)&local_78,">",(allocator *)(delimiter.field_2._M_local_buf + 0xe));
      _Var2 = std::operator==(__lhs,&local_78);
      if (_Var2) {
        std::__cxx11::string::~string((string *)&local_78);
LAB_00316825:
        bVar1 = Consume(this,(string *)local_58);
        goto LAB_00316833;
      }
      std::__cxx11::string::string
                ((string *)&local_98,"}",(allocator *)(delimiter.field_2._M_local_buf + 0xf));
      _Var2 = std::operator==(__lhs,&local_98);
      std::__cxx11::string::~string((string *)&local_98);
      std::__cxx11::string::~string((string *)&local_78);
      if (_Var2) goto LAB_00316825;
      bVar1 = SkipField(this);
    } while (bVar1);
  }
  bVar1 = false;
LAB_00316833:
  std::__cxx11::string::~string((string *)local_58);
  return bVar1;
}

Assistant:

bool SkipFieldMessage() {
    std::string delimiter;
    DO(ConsumeMessageDelimiter(&delimiter));
    while (!LookingAt(">") && !LookingAt("}")) {
      DO(SkipField());
    }
    DO(Consume(delimiter));
    return true;
  }